

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setSources
          (Program *this,string *vertSource,string *fragSource)

{
  char *fragSourceCstr;
  char *vertSourceCstr;
  pointer local_30;
  pointer local_28;
  
  local_28 = (vertSource->_M_dataplus)._M_p;
  local_30 = (fragSource->_M_dataplus)._M_p;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->m_fragSource);
  glwShaderSource(this->m_vertShaderGL,1,&local_28,(GLint *)0x0);
  glwShaderSource(this->m_fragShaderGL,1,&local_30,(GLint *)0x0);
  this->m_hasSources = true;
  return;
}

Assistant:

void Program::setSources (const string& vertSource, const string& fragSource)
{
	const char* const vertSourceCstr = vertSource.c_str();
	const char* const fragSourceCstr = fragSource.c_str();

	m_vertSource = vertSource;
	m_fragSource = fragSource;

	// \note In GLES2 api the source parameter type lacks one const.
	glShaderSource(m_vertShaderGL, 1, (const char**)&vertSourceCstr, DE_NULL);
	glShaderSource(m_fragShaderGL, 1, (const char**)&fragSourceCstr, DE_NULL);

	m_hasSources = true;
}